

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

void __thiscall
btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert
          (btHashMap<btHashKey<btTriIndex>,_btTriIndex> *this,btHashKey<btTriIndex> *key,
          btTriIndex *value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  btTriIndex *ptr;
  btHashKey<btTriIndex> *ptr_00;
  int *piVar5;
  btCollisionShape *pbVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  int iVar9;
  uint uVar10;
  btTriIndex *pbVar11;
  btHashKey<btTriIndex> *pbVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  
  iVar3 = key->m_uid;
  iVar16 = (this->m_valueArray).m_capacity;
  iVar9 = findIndex(this,key);
  if (iVar9 != -1) {
    uVar8 = *(undefined4 *)&value->field_0x4;
    pbVar6 = value->m_childShape;
    pbVar11 = (this->m_valueArray).m_data + iVar9;
    pbVar11->m_PartIdTriangleIndex = value->m_PartIdTriangleIndex;
    *(undefined4 *)&pbVar11->field_0x4 = uVar8;
    pbVar11->m_childShape = pbVar6;
    return;
  }
  uVar4 = (this->m_valueArray).m_size;
  uVar13 = (this->m_valueArray).m_capacity;
  uVar10 = uVar4;
  if (uVar4 == uVar13) {
    iVar9 = 1;
    if (uVar4 != 0) {
      iVar9 = uVar4 * 2;
    }
    if ((int)uVar4 < iVar9) {
      if (iVar9 == 0) {
        pbVar11 = (btTriIndex *)0x0;
      }
      else {
        pbVar11 = (btTriIndex *)btAlignedAllocInternal((long)iVar9 << 4,0x10);
        uVar10 = (this->m_valueArray).m_size;
      }
      if (0 < (int)uVar10) {
        lVar14 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)&((this->m_valueArray).m_data)->m_PartIdTriangleIndex + lVar14);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pbVar11->m_PartIdTriangleIndex + lVar14);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar10 << 4 != lVar14);
      }
      ptr = (this->m_valueArray).m_data;
      if ((ptr != (btTriIndex *)0x0) && ((this->m_valueArray).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_valueArray).m_ownsMemory = true;
      (this->m_valueArray).m_data = pbVar11;
      (this->m_valueArray).m_capacity = iVar9;
      uVar10 = (this->m_valueArray).m_size;
    }
  }
  uVar8 = *(undefined4 *)&value->field_0x4;
  pbVar6 = value->m_childShape;
  pbVar11 = (this->m_valueArray).m_data + (int)uVar10;
  pbVar11->m_PartIdTriangleIndex = value->m_PartIdTriangleIndex;
  *(undefined4 *)&pbVar11->field_0x4 = uVar8;
  pbVar11->m_childShape = pbVar6;
  piVar5 = &(this->m_valueArray).m_size;
  *piVar5 = *piVar5 + 1;
  uVar10 = (this->m_keyArray).m_size;
  if (uVar10 != (this->m_keyArray).m_capacity) goto LAB_001e7d39;
  iVar9 = 1;
  if (uVar10 != 0) {
    iVar9 = uVar10 * 2;
  }
  if (iVar9 <= (int)uVar10) goto LAB_001e7d39;
  if (iVar9 == 0) {
    pbVar12 = (btHashKey<btTriIndex> *)0x0;
  }
  else {
    pbVar12 = (btHashKey<btTriIndex> *)btAlignedAllocInternal((long)iVar9 << 2,0x10);
    uVar10 = (this->m_keyArray).m_size;
  }
  ptr_00 = (this->m_keyArray).m_data;
  if ((int)uVar10 < 1) {
    if (ptr_00 != (btHashKey<btTriIndex> *)0x0) goto LAB_001e7d18;
  }
  else {
    uVar15 = 0;
    do {
      pbVar12[uVar15].m_uid = ptr_00[uVar15].m_uid;
      uVar15 = uVar15 + 1;
    } while (uVar10 != uVar15);
LAB_001e7d18:
    if ((this->m_keyArray).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_00);
    }
    uVar10 = (this->m_keyArray).m_size;
  }
  (this->m_keyArray).m_ownsMemory = true;
  (this->m_keyArray).m_data = pbVar12;
  (this->m_keyArray).m_capacity = iVar9;
LAB_001e7d39:
  (this->m_keyArray).m_data[(int)uVar10].m_uid = key->m_uid;
  piVar5 = &(this->m_keyArray).m_size;
  *piVar5 = *piVar5 + 1;
  if ((int)uVar13 < (this->m_valueArray).m_capacity) {
    growTables(this,key);
    uVar13 = ~(key->m_uid << 0xf) + key->m_uid;
    uVar13 = ((int)uVar13 >> 10 ^ uVar13) * 9;
    uVar13 = (int)uVar13 >> 6 ^ uVar13;
    uVar13 = ~(uVar13 << 0xb) + uVar13;
    uVar13 = (int)uVar13 >> 0x10 ^ uVar13;
    iVar16 = (this->m_valueArray).m_capacity;
  }
  else {
    uVar13 = ~(iVar3 << 0xf) + iVar3;
    uVar13 = ((int)uVar13 >> 10 ^ uVar13) * 9;
    uVar13 = (int)uVar13 >> 6 ^ uVar13;
    uVar13 = ~(uVar13 << 0xb) + uVar13;
    uVar13 = (int)uVar13 >> 0x10 ^ uVar13;
  }
  uVar13 = iVar16 - 1U & uVar13;
  piVar5 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar4] = piVar5[(int)uVar13];
  piVar5[(int)uVar13] = uVar4;
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}